

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_statistics.cpp
# Opt level: O2

shared_ptr<duckdb::ColumnStatistics,_true> __thiscall
duckdb::ColumnStatistics::CreateEmptyStats(ColumnStatistics *this,LogicalType *type)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ColumnStatistics,_true> sVar1;
  LogicalType local_80;
  BaseStatistics local_68;
  
  LogicalType::LogicalType(&local_80,type);
  BaseStatistics::CreateEmpty(&local_68,&local_80);
  make_shared_ptr<duckdb::ColumnStatistics,duckdb::BaseStatistics>(&this->stats);
  BaseStatistics::~BaseStatistics(&local_68);
  LogicalType::~LogicalType(&local_80);
  sVar1.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::ColumnStatistics,_true>)
         sVar1.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ColumnStatistics> ColumnStatistics::CreateEmptyStats(const LogicalType &type) {
	return make_shared_ptr<ColumnStatistics>(BaseStatistics::CreateEmpty(type));
}